

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

IsMineResult
wallet::anon_unknown_1::IsMineInner
          (LegacyDataSPKM *keystore,CScript *scriptPubKey,IsMineSigVersion sigversion,
          bool recurse_scripthash)

{
  Span<const_unsigned_char> _vch;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  byte bVar1;
  bool bVar2;
  IsMineSigVersion sigversion_00;
  size_type sVar3;
  IsMineResult *pIVar4;
  undefined1 in_CL;
  int in_EDX;
  LegacyDataSPKM *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  TxoutType whichType;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  keys;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  IsMineResult ret;
  CScript subscript_1;
  CScriptID scriptID_1;
  CScript subscript;
  CScriptID scriptID;
  CPubKey pubkey;
  CKeyID keyID;
  undefined4 in_stack_fffffffffffffaa8;
  IsMineSigVersion in_stack_fffffffffffffaac;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  LegacyDataSPKM *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  allocator_type *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  opcodetype in_stack_fffffffffffffadc;
  CScript *in_stack_fffffffffffffae0;
  ulong uVar5;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __last;
  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __first;
  byte local_4a1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffbd0;
  CScript *in_stack_fffffffffffffbd8;
  long *plVar6;
  byte local_409;
  ulong local_3d8;
  int local_3b8;
  undefined1 in_stack_fffffffffffffc5b;
  undefined3 in_stack_fffffffffffffc60;
  uint uVar7;
  IsMineResult local_388;
  size_t local_340;
  uchar *local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  IsMineResult local_294;
  undefined1 local_290 [32];
  uchar local_270 [20];
  undefined1 local_25c [20];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_21c [20];
  undefined1 local_208 [59];
  undefined1 local_1cd [20];
  undefined1 local_1b9 [85];
  undefined8 local_164;
  undefined8 uStack_15c;
  undefined4 local_154;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_91 [85];
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = CONCAT13(in_CL,in_stack_fffffffffffffc60) & 0x1ffffff;
  local_294 = NO;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  sigversion_00 = Solver(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  CKeyID::CKeyID((CKeyID *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  switch(sigversion_00) {
  case TOP:
  case P2SH:
  case 6:
  case 9:
  case 10:
    break;
  case WITNESS_V0:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (size_type)in_stack_fffffffffffffab0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0,
               (type)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    _vch.m_size._0_7_ = in_stack_fffffffffffffac8;
    _vch.m_data = (uchar *)in_stack_fffffffffffffac0;
    _vch.m_size._7_1_ = in_stack_fffffffffffffacf;
    CPubKey::CPubKey((CPubKey *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),_vch);
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffad0);
    local_18 = local_2c;
    local_28 = local_3c;
    uStack_20 = uStack_34;
    bVar2 = PermitsUncompressed(in_stack_fffffffffffffaac);
    if (!bVar2) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (size_type)in_stack_fffffffffffffab0);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      if (sVar3 != 0x21) {
        local_388 = INVALID;
        goto LAB_0166699a;
      }
    }
    bVar1 = (**(code **)(*in_RDI + 0xe8))(in_RDI,&local_28);
    if ((bVar1 & 1) != 0) {
      pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                         ((IsMineResult *)in_stack_fffffffffffffab0,
                          (IsMineResult *)
                          CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_294 = *pIVar4;
    }
    break;
  case WITNESS_V0|P2SH:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (size_type)in_stack_fffffffffffffab0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0,
               (type)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    vch_00.m_size._0_7_ = in_stack_fffffffffffffac8;
    vch_00.m_data = (uchar *)in_stack_fffffffffffffac0;
    vch_00.m_size._7_1_ = in_stack_fffffffffffffacf;
    uint160::uint160((uint160 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),vch_00
                    );
    CKeyID::CKeyID((CKeyID *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                   (uint160 *)0x16660ab);
    local_18 = local_154;
    local_28 = local_164;
    uStack_20 = uStack_15c;
    bVar2 = PermitsUncompressed(in_stack_fffffffffffffaac);
    if (!bVar2) {
      CPubKey::CPubKey((CPubKey *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      bVar1 = (**(code **)(*in_RDI + 0xf8))(in_RDI,&local_28,local_1b9);
      if (((bVar1 & 1) != 0) &&
         (bVar2 = CPubKey::IsCompressed
                            ((CPubKey *)
                             CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)), !bVar2)
         ) {
        local_388 = INVALID;
        goto LAB_0166699a;
      }
    }
    bVar1 = (**(code **)(*in_RDI + 0xe8))(in_RDI,&local_28);
    if ((bVar1 & 1) != 0) {
      pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                         ((IsMineResult *)in_stack_fffffffffffffab0,
                          (IsMineResult *)
                          CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_294 = *pIVar4;
    }
    break;
  case 4:
    if (in_EDX != 0) {
      local_388 = INVALID;
      goto LAB_0166699a;
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (size_type)in_stack_fffffffffffffab0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0,
               (type)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    vch_01.m_size._0_7_ = in_stack_fffffffffffffac8;
    vch_01.m_data = (uchar *)in_stack_fffffffffffffac0;
    vch_01.m_size._7_1_ = in_stack_fffffffffffffacf;
    uint160::uint160((uint160 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),vch_01
                    );
    CScriptID::CScriptID
              ((CScriptID *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (uint160 *)0x1666278);
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    bVar1 = (**(code **)(in_RDI[0xb] + 0x10))(in_RDI + 0xb,local_1cd,local_208);
    if ((bVar1 & 1) != 0) {
      if ((uVar7 & 0x1000000) != 0) {
        IsMineInner(in_RSI,(CScript *)CONCAT44(in_EDX,uVar7),sigversion_00,
                    (bool)in_stack_fffffffffffffc5b);
      }
      pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                         ((IsMineResult *)in_stack_fffffffffffffab0,
                          (IsMineResult *)
                          CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_294 = *pIVar4;
    }
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    break;
  case 5:
    if (in_EDX != 0) {
      __last._M_current = &local_2b0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::begin(in_stack_fffffffffffffab0);
      __first._M_current = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1;
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator+((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                  (difference_type)in_stack_fffffffffffffab0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::begin(in_stack_fffffffffffffab0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator+((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                  (difference_type)in_stack_fffffffffffffab0);
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator-((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                  (difference_type)in_stack_fffffffffffffab0);
      std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),__first,__last,
                 in_stack_fffffffffffffad0);
      std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      bVar2 = PermitsUncompressed(in_stack_fffffffffffffaac);
      if (!bVar2) {
        local_3d8 = 0;
        while (uVar5 = local_3d8,
              sVar3 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)),
              uVar5 < sVar3) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                       (size_type)in_stack_fffffffffffffab0);
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
          if (sVar3 != 0x21) {
            local_388 = INVALID;
            local_3b8 = 1;
            goto LAB_01666902;
          }
          local_3d8 = local_3d8 + 1;
        }
      }
      bVar2 = HaveKeys((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                       in_stack_fffffffffffffac0);
      in_stack_fffffffffffffadc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffadc);
      if (bVar2) {
        in_stack_fffffffffffffad0 =
             (allocator_type *)
             std::max<wallet::(anonymous_namespace)::IsMineResult>
                       ((IsMineResult *)in_stack_fffffffffffffab0,
                        (IsMineResult *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        local_294 = *(IsMineResult *)in_stack_fffffffffffffad0;
      }
      local_3b8 = 2;
LAB_01666902:
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      if (local_3b8 != 2) goto LAB_0166699a;
    }
    break;
  case 7:
    if (in_EDX == 2) {
      local_388 = INVALID;
      goto LAB_0166699a;
    }
    local_4a1 = 0;
    if (in_EDX == 0) {
      local_238 = 0;
      uStack_230 = 0;
      local_248 = 0;
      uStack_240 = 0;
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      CScript::operator<<(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (size_type)in_stack_fffffffffffffab0);
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0)
      ;
      b_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffae8;
      b_00._M_ptr = (pointer)in_stack_fffffffffffffae0;
      b_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffaef;
      CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                          b_00);
      CScriptID::CScriptID
                ((CScriptID *)in_stack_fffffffffffffac0,
                 (CScript *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      local_4a1 = (**(code **)(in_RDI[0xb] + 0x18))(in_RDI + 0xb,local_21c);
      local_4a1 = local_4a1 ^ 0xff;
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
    if ((local_4a1 & 1) == 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (size_type)in_stack_fffffffffffffab0);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0,
                 (type)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      RIPEMD160(local_270,local_340,local_338);
      CScriptID::CScriptID
                ((CScriptID *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (uint160 *)0x16665af);
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      bVar1 = (**(code **)(in_RDI[0xb] + 0x10))(in_RDI + 0xb,local_25c,local_290);
      if ((bVar1 & 1) != 0) {
        if ((uVar7 & 0x1000000) != 0) {
          IsMineInner(in_RSI,(CScript *)CONCAT44(in_EDX,uVar7),sigversion_00,
                      (bool)in_stack_fffffffffffffc5b);
        }
        pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                           ((IsMineResult *)in_stack_fffffffffffffab0,
                            (IsMineResult *)
                            CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        local_294 = *pIVar4;
      }
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
    break;
  case 8:
    if (in_EDX == 2) {
      local_388 = INVALID;
      goto LAB_0166699a;
    }
    local_409 = 0;
    if (in_EDX == 0) {
      plVar6 = in_RDI + 0xb;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      CScript::operator<<(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (size_type)in_stack_fffffffffffffab0);
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0)
      ;
      b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffae8;
      b._M_ptr = (pointer)in_stack_fffffffffffffae0;
      b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffaef;
      CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),b
                         );
      CScriptID::CScriptID
                ((CScriptID *)in_stack_fffffffffffffac0,
                 (CScript *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      local_409 = (**(code **)(*plVar6 + 0x18))(plVar6,local_91);
      local_409 = local_409 ^ 0xff;
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
    if ((local_409 & 1) == 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (size_type)in_stack_fffffffffffffab0);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffab0,
                 (type)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      vch.m_size._0_7_ = in_stack_fffffffffffffac8;
      vch.m_data = (uchar *)in_stack_fffffffffffffac0;
      vch.m_size._7_1_ = in_stack_fffffffffffffacf;
      uint160::uint160((uint160 *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),vch)
      ;
      PKHash::PKHash((PKHash *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                     (uint160 *)0x1665f38);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<PKHash,void,void,PKHash,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (PKHash *)in_stack_fffffffffffffab0);
      GetScriptForDestination
                ((CTxDestination *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      IsMineInner(in_RSI,(CScript *)CONCAT44(in_EDX,uVar7),sigversion_00,
                  (bool)in_stack_fffffffffffffc5b);
      pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                         ((IsMineResult *)in_stack_fffffffffffffab0,
                          (IsMineResult *)
                          CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_294 = *pIVar4;
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
  }
  if ((local_294 == NO) &&
     (bVar2 = LegacyDataSPKM::HaveWatchOnly
                        ((LegacyDataSPKM *)
                         CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                         (CScript *)in_stack_fffffffffffffad0), bVar2)) {
    pIVar4 = std::max<wallet::(anonymous_namespace)::IsMineResult>
                       ((IsMineResult *)in_stack_fffffffffffffab0,
                        (IsMineResult *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_294 = *pIVar4;
  }
  local_388 = local_294;
LAB_0166699a:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_388;
  }
  __stack_chk_fail();
}

Assistant:

IsMineResult IsMineInner(const LegacyDataSPKM& keystore, const CScript& scriptPubKey, IsMineSigVersion sigversion, bool recurse_scripthash=true)
{
    IsMineResult ret = IsMineResult::NO;

    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    CKeyID keyID;
    switch (whichType) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        break;
    case TxoutType::PUBKEY:
        keyID = CPubKey(vSolutions[0]).GetID();
        if (!PermitsUncompressed(sigversion) && vSolutions[0].size() != 33) {
            return IsMineResult::INVALID;
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::WITNESS_V0_KEYHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WPKH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            // We do not support bare witness outputs unless the P2SH version of it would be
            // acceptable as well. This protects against matching before segwit activates.
            // This also applies to the P2WSH case.
            break;
        }
        ret = std::max(ret, IsMineInner(keystore, GetScriptForDestination(PKHash(uint160(vSolutions[0]))), IsMineSigVersion::WITNESS_V0));
        break;
    }
    case TxoutType::PUBKEYHASH:
        keyID = CKeyID(uint160(vSolutions[0]));
        if (!PermitsUncompressed(sigversion)) {
            CPubKey pubkey;
            if (keystore.GetPubKey(keyID, pubkey) && !pubkey.IsCompressed()) {
                return IsMineResult::INVALID;
            }
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::SCRIPTHASH:
    {
        if (sigversion != IsMineSigVersion::TOP) {
            // P2SH inside P2WSH or P2SH is invalid.
            return IsMineResult::INVALID;
        }
        CScriptID scriptID = CScriptID(uint160(vSolutions[0]));
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::P2SH) : IsMineResult::SPENDABLE);
        }
        break;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WSH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            break;
        }
        CScriptID scriptID{RIPEMD160(vSolutions[0])};
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::WITNESS_V0) : IsMineResult::SPENDABLE);
        }
        break;
    }

    case TxoutType::MULTISIG:
    {
        // Never treat bare multisig outputs as ours (they can still be made watchonly-though)
        if (sigversion == IsMineSigVersion::TOP) {
            break;
        }

        // Only consider transactions "mine" if we own ALL the
        // keys involved. Multi-signature transactions that are
        // partially owned (somebody else has a key that can spend
        // them) enable spend-out-from-under-you attacks, especially
        // in shared-wallet situations.
        std::vector<valtype> keys(vSolutions.begin()+1, vSolutions.begin()+vSolutions.size()-1);
        if (!PermitsUncompressed(sigversion)) {
            for (size_t i = 0; i < keys.size(); i++) {
                if (keys[i].size() != 33) {
                    return IsMineResult::INVALID;
                }
            }
        }
        if (HaveKeys(keys, keystore)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    }
    } // no default case, so the compiler can warn about missing cases

    if (ret == IsMineResult::NO && keystore.HaveWatchOnly(scriptPubKey)) {
        ret = std::max(ret, IsMineResult::WATCH_ONLY);
    }
    return ret;
}